

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

unsigned_long * __thiscall kj::Arena::allocate<unsigned_long>(Arena *this)

{
  unsigned_long *puVar1;
  unsigned_long *result;
  Arena *this_local;
  
  puVar1 = (unsigned_long *)allocateBytes(this,8,8,false);
  return puVar1;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !__has_trivial_destructor(T)));
  if (!__has_trivial_constructor(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!__has_trivial_destructor(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}